

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O0

tm * __thiscall cmCTest::GetNightlyTime(cmCTest *this,string *str,bool tomorrowtag)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  undefined8 uVar4;
  ostream *poVar5;
  char *pcVar6;
  void *pvVar7;
  tm *ptVar8;
  string local_1448 [32];
  ostringstream local_1428 [8];
  ostringstream cmCTestLog_msg_9;
  string local_12b0 [32];
  ostringstream local_1290 [8];
  ostringstream cmCTestLog_msg_8;
  string local_1118 [32];
  ostringstream local_10f8 [8];
  ostringstream cmCTestLog_msg_7;
  string local_f80 [32];
  ostringstream local_f60 [8];
  ostringstream cmCTestLog_msg_6;
  string local_de8 [32];
  ostringstream local_dc8 [8];
  ostringstream cmCTestLog_msg_5;
  string local_c50 [32];
  ostringstream local_c30 [8];
  ostringstream cmCTestLog_msg_4;
  string local_ab8 [32];
  ostringstream local_a98 [8];
  ostringstream cmCTestLog_msg_3;
  string local_918 [4];
  int dayLength;
  ostringstream local_8f8 [8];
  ostringstream cmCTestLog_msg_2;
  string local_780 [32];
  ostringstream local_760 [8];
  ostringstream cmCTestLog_msg_1;
  time_t local_5e8;
  time_t ntime;
  ostringstream local_5b0 [8];
  ostringstream cmCTestLog_msg;
  char local_438 [8];
  char buf [1024];
  time_t local_30;
  time_t tctime;
  tm *lctime;
  string *psStack_18;
  bool tomorrowtag_local;
  string *str_local;
  cmCTest *this_local;
  
  lctime._7_1_ = tomorrowtag;
  psStack_18 = str;
  str_local = (string *)this;
  local_30 = time((time_t *)0x0);
  tctime = (time_t)gmtime(&local_30);
  iVar1 = ((tm *)tctime)->tm_year;
  iVar2 = ((tm *)tctime)->tm_mon;
  uVar3 = ((tm *)tctime)->tm_mday;
  uVar4 = std::__cxx11::string::c_str();
  snprintf(local_438,0x400,"%d%02d%02d %s",(ulong)(iVar1 + 0x76c),(ulong)(iVar2 + 1),(ulong)uVar3,
           uVar4);
  std::__cxx11::ostringstream::ostringstream(local_5b0);
  poVar5 = std::operator<<((ostream *)local_5b0,"Determine Nightly Start Time");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<(poVar5,"   Specified time: ");
  poVar5 = std::operator<<(poVar5,(string *)psStack_18);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  std::__cxx11::ostringstream::str();
  pcVar6 = (char *)std::__cxx11::string::c_str();
  Log(this,1,
      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx",
      0xf3,pcVar6,false);
  std::__cxx11::string::~string((string *)&ntime);
  std::__cxx11::ostringstream::~ostringstream(local_5b0);
  local_5e8 = curl_getdate(local_438,&local_30);
  std::__cxx11::ostringstream::ostringstream(local_760);
  poVar5 = std::operator<<((ostream *)local_760,"   Get curl time: ");
  pvVar7 = (void *)std::ostream::operator<<(poVar5,local_5e8);
  std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
  std::__cxx11::ostringstream::str();
  pcVar6 = (char *)std::__cxx11::string::c_str();
  Log(this,0,
      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx",
      0xfb,pcVar6,false);
  std::__cxx11::string::~string(local_780);
  std::__cxx11::ostringstream::~ostringstream(local_760);
  local_30 = time((time_t *)0x0);
  std::__cxx11::ostringstream::ostringstream(local_8f8);
  poVar5 = std::operator<<((ostream *)local_8f8,"   Get the current time: ");
  pvVar7 = (void *)std::ostream::operator<<(poVar5,local_30);
  std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
  std::__cxx11::ostringstream::str();
  pcVar6 = (char *)std::__cxx11::string::c_str();
  Log(this,0,
      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx",
      0xfd,pcVar6,false);
  std::__cxx11::string::~string(local_918);
  std::__cxx11::ostringstream::~ostringstream(local_8f8);
  std::__cxx11::ostringstream::ostringstream(local_a98);
  poVar5 = std::operator<<((ostream *)local_a98,"Seconds: ");
  pvVar7 = (void *)std::ostream::operator<<(poVar5,local_30);
  std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
  std::__cxx11::ostringstream::str();
  pcVar6 = (char *)std::__cxx11::string::c_str();
  Log(this,0,
      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx",
      0x100,pcVar6,false);
  std::__cxx11::string::~string(local_ab8);
  std::__cxx11::ostringstream::~ostringstream(local_a98);
  while (local_30 < local_5e8) {
    local_5e8 = local_5e8 + -0x15180;
    std::__cxx11::ostringstream::ostringstream(local_c30);
    poVar5 = std::operator<<((ostream *)local_c30,"Pick yesterday");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    std::__cxx11::ostringstream::str();
    pcVar6 = (char *)std::__cxx11::string::c_str();
    Log(this,0,
        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx"
        ,0x108,pcVar6,false);
    std::__cxx11::string::~string(local_c50);
    std::__cxx11::ostringstream::~ostringstream(local_c30);
    std::__cxx11::ostringstream::ostringstream(local_dc8);
    poVar5 = std::operator<<((ostream *)local_dc8,"   Future time, subtract day: ");
    pvVar7 = (void *)std::ostream::operator<<(poVar5,local_5e8);
    std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
    std::__cxx11::ostringstream::str();
    pcVar6 = (char *)std::__cxx11::string::c_str();
    Log(this,0,
        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx"
        ,0x10a,pcVar6,false);
    std::__cxx11::string::~string(local_de8);
    std::__cxx11::ostringstream::~ostringstream(local_dc8);
  }
  while (local_5e8 + 0x15180 < local_30) {
    local_5e8 = local_5e8 + 0x15180;
    std::__cxx11::ostringstream::ostringstream(local_f60);
    poVar5 = std::operator<<((ostream *)local_f60,"   Past time, add day: ");
    pvVar7 = (void *)std::ostream::operator<<(poVar5,local_5e8);
    std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
    std::__cxx11::ostringstream::str();
    pcVar6 = (char *)std::__cxx11::string::c_str();
    Log(this,0,
        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx"
        ,0x10e,pcVar6,false);
    std::__cxx11::string::~string(local_f80);
    std::__cxx11::ostringstream::~ostringstream(local_f60);
  }
  std::__cxx11::ostringstream::ostringstream(local_10f8);
  poVar5 = std::operator<<((ostream *)local_10f8,"nightlySeconds: ");
  pvVar7 = (void *)std::ostream::operator<<(poVar5,local_5e8);
  std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
  std::__cxx11::ostringstream::str();
  pcVar6 = (char *)std::__cxx11::string::c_str();
  Log(this,0,
      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx",
      0x110,pcVar6,false);
  std::__cxx11::string::~string(local_1118);
  std::__cxx11::ostringstream::~ostringstream(local_10f8);
  std::__cxx11::ostringstream::ostringstream(local_1290);
  poVar5 = std::operator<<((ostream *)local_1290,"   Current time: ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_30);
  poVar5 = std::operator<<(poVar5," Nightly time: ");
  pvVar7 = (void *)std::ostream::operator<<(poVar5,local_5e8);
  std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
  std::__cxx11::ostringstream::str();
  pcVar6 = (char *)std::__cxx11::string::c_str();
  Log(this,0,
      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx",
      0x113,pcVar6,false);
  std::__cxx11::string::~string(local_12b0);
  std::__cxx11::ostringstream::~ostringstream(local_1290);
  if ((lctime._7_1_ & 1) != 0) {
    std::__cxx11::ostringstream::ostringstream(local_1428);
    poVar5 = std::operator<<((ostream *)local_1428,"   Use future tag, Add a day");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    std::__cxx11::ostringstream::str();
    pcVar6 = (char *)std::__cxx11::string::c_str();
    Log(this,1,
        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx"
        ,0x115,pcVar6,false);
    std::__cxx11::string::~string(local_1448);
    std::__cxx11::ostringstream::~ostringstream(local_1428);
    local_5e8 = local_5e8 + 0x15180;
  }
  ptVar8 = gmtime(&local_5e8);
  return (tm *)ptVar8;
}

Assistant:

struct tm* cmCTest::GetNightlyTime(std::string const& str, bool tomorrowtag)
{
  struct tm* lctime;
  time_t tctime = time(nullptr);
  lctime = gmtime(&tctime);
  char buf[1024];
  // add todays year day and month to the time in str because
  // curl_getdate no longer assumes the day is today
  snprintf(buf, sizeof(buf), "%d%02d%02d %s", lctime->tm_year + 1900,
           lctime->tm_mon + 1, lctime->tm_mday, str.c_str());
  cmCTestLog(this, OUTPUT,
             "Determine Nightly Start Time" << std::endl
                                            << "   Specified time: " << str
                                            << std::endl);
  // Convert the nightly start time to seconds. Since we are
  // providing only a time and a timezone, the current date of
  // the local machine is assumed. Consequently, nightlySeconds
  // is the time at which the nightly dashboard was opened or
  // will be opened on the date of the current client machine.
  // As such, this time may be in the past or in the future.
  time_t ntime = curl_getdate(buf, &tctime);
  cmCTestLog(this, DEBUG, "   Get curl time: " << ntime << std::endl);
  tctime = time(nullptr);
  cmCTestLog(this, DEBUG, "   Get the current time: " << tctime << std::endl);

  const int dayLength = 24 * 60 * 60;
  cmCTestLog(this, DEBUG, "Seconds: " << tctime << std::endl);
  while (ntime > tctime) {
    // If nightlySeconds is in the past, this is the current
    // open dashboard, then return nightlySeconds.  If
    // nightlySeconds is in the future, this is the next
    // dashboard to be opened, so subtract 24 hours to get the
    // time of the current open dashboard
    ntime -= dayLength;
    cmCTestLog(this, DEBUG, "Pick yesterday" << std::endl);
    cmCTestLog(this, DEBUG,
               "   Future time, subtract day: " << ntime << std::endl);
  }
  while (tctime > (ntime + dayLength)) {
    ntime += dayLength;
    cmCTestLog(this, DEBUG, "   Past time, add day: " << ntime << std::endl);
  }
  cmCTestLog(this, DEBUG, "nightlySeconds: " << ntime << std::endl);
  cmCTestLog(this, DEBUG,
             "   Current time: " << tctime << " Nightly time: " << ntime
                                 << std::endl);
  if (tomorrowtag) {
    cmCTestLog(this, OUTPUT, "   Use future tag, Add a day" << std::endl);
    ntime += dayLength;
  }
  lctime = gmtime(&ntime);
  return lctime;
}